

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::Reset(CPU *this,uint16_t start)

{
  uint16_t start_local;
  CPU *this_local;
  
  this->pc = start;
  this->sp = 0xff;
  (this->field_6).ps = (this->field_6).ps & 0x7f;
  (this->field_6).ps = (this->field_6).ps & 0xbf;
  (this->field_6).ps = (this->field_6).ps & 0xdf;
  (this->field_6).ps = (this->field_6).ps & 0xf7;
  (this->field_6).ps = (this->field_6).ps & 0xfb;
  (this->field_6).ps = (this->field_6).ps & 0xfd;
  (this->field_6).ps = (this->field_6).ps & 0xfe;
  (this->field_6).ps = (this->field_6).ps & 0xef | 0x10;
  this->Y = '\0';
  this->X = '\0';
  this->A = '\0';
  this->cycles = 0;
  return;
}

Assistant:

void CPU::Reset(uint16_t start)
{
    pc = start;
    sp = 0xFF;
    C = Z = I = D = B = V = N = 0;
    U = 1;
    A = X = Y = 0;
    cycles = 0;
}